

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codec.cpp
# Opt level: O3

void CodeAperiodicity(double **aperiodicity,int f0_length,int fs,int fft_size,
                     double **coded_aperiodicity)

{
  undefined1 auVar1 [16];
  uint xi_length;
  double *xi;
  double *y;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  uint x_length;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  long lVar10;
  
  dVar5 = (double)fs * 0.5 + -3000.0;
  dVar6 = 15000.0;
  if (dVar5 <= 15000.0) {
    dVar6 = dVar5;
  }
  xi_length = (uint)(dVar6 / 3000.0);
  uVar3 = (long)(int)xi_length * 8;
  if ((int)xi_length < 0) {
    uVar3 = 0xffffffffffffffff;
  }
  xi = (double *)operator_new__(uVar3);
  auVar1 = _DAT_0010e320;
  if (0 < (int)xi_length) {
    lVar2 = (ulong)xi_length - 1;
    auVar7._8_4_ = (int)lVar2;
    auVar7._0_8_ = lVar2;
    auVar7._12_4_ = (int)((ulong)lVar2 >> 0x20);
    lVar2 = 0;
    auVar7 = auVar7 ^ _DAT_0010e320;
    auVar8 = _DAT_0010e310;
    do {
      auVar9 = auVar8 ^ auVar1;
      lVar10 = auVar8._8_8_;
      if ((bool)(~(auVar9._4_4_ == auVar7._4_4_ && auVar7._0_4_ < auVar9._0_4_ ||
                  auVar7._4_4_ < auVar9._4_4_) & 1)) {
        *(double *)((long)xi + lVar2) = (double)(int)(auVar8._0_8_ + 1) * 3000.0;
      }
      if ((auVar9._12_4_ != auVar7._12_4_ || auVar9._8_4_ <= auVar7._8_4_) &&
          auVar9._12_4_ <= auVar7._12_4_) {
        *(double *)((long)xi + lVar2 + 8) = (double)(int)(lVar10 + 1) * 3000.0;
      }
      auVar8._0_8_ = auVar8._0_8_ + 2;
      auVar8._8_8_ = lVar10 + 2;
      lVar2 = lVar2 + 0x10;
    } while ((ulong)(xi_length + 1 >> 1) << 4 != lVar2);
  }
  uVar3 = (long)(fft_size / 2) * 8 + 8;
  if (fft_size < -3) {
    uVar3 = 0xffffffffffffffff;
  }
  y = (double *)operator_new__(uVar3);
  if (0 < f0_length) {
    x_length = fft_size / 2 + 1;
    uVar3 = 0;
    do {
      if (-2 < fft_size) {
        uVar4 = 0;
        do {
          dVar6 = log10(aperiodicity[uVar3][uVar4]);
          y[uVar4] = dVar6 * 20.0;
          uVar4 = uVar4 + 1;
        } while (x_length != uVar4);
      }
      interp1Q(0.0,(double)fs / (double)fft_size,y,x_length,xi,xi_length,coded_aperiodicity[uVar3]);
      uVar3 = uVar3 + 1;
    } while (uVar3 != (uint)f0_length);
  }
  operator_delete__(xi);
  operator_delete__(y);
  return;
}

Assistant:

void CodeAperiodicity(const double * const *aperiodicity, int f0_length,
    int fs, int fft_size, double **coded_aperiodicity) {
  int number_of_aperiodicities = GetNumberOfAperiodicities(fs);
  double *coarse_frequency_axis = new double[number_of_aperiodicities];
  for (int i = 0; i < number_of_aperiodicities; ++i)
    coarse_frequency_axis[i] = world::kFrequencyInterval * (i + 1.0);

  double *log_aperiodicity = new double[fft_size / 2 + 1];

  for (int i = 0; i < f0_length; ++i) {
    for (int j = 0; j < fft_size / 2 + 1; ++j)
      log_aperiodicity[j] = 20 * log10(aperiodicity[i][j]);
    interp1Q(0, static_cast<double>(fs) / fft_size, log_aperiodicity,
        fft_size / 2 + 1, coarse_frequency_axis, number_of_aperiodicities,
        coded_aperiodicity[i]);
  }

  delete[] coarse_frequency_axis;
  delete[] log_aperiodicity;
}